

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# open62541.c
# Opt level: O0

UA_StatusCode
UA_Connection_receiveChunksBlocking
          (UA_Connection *connection,UA_ByteString *chunks,UA_Boolean *realloced,UA_UInt32 timeout)

{
  UA_StatusCode UVar1;
  UA_StatusCode UVar2;
  UA_DateTime UVar3;
  long lVar4;
  UA_StatusCode retval;
  UA_DateTime maxDate;
  UA_DateTime now;
  UA_UInt32 timeout_local;
  UA_Boolean *realloced_local;
  UA_ByteString *chunks_local;
  UA_Connection *connection_local;
  
  UVar3 = UA_DateTime_nowMonotonic();
  lVar4 = UVar3 + (ulong)timeout * 10000;
  *realloced = false;
  now._4_4_ = timeout;
  while( true ) {
    UVar1 = (*connection->recv)(connection,chunks,now._4_4_);
    UVar2 = UA_Connection_completeMessages(connection,chunks,realloced);
    if ((UVar2 | UVar1) != 0) {
      return UVar2 | UVar1;
    }
    if (chunks->length != 0) break;
    UVar3 = UA_DateTime_nowMonotonic();
    if (lVar4 < UVar3) {
      return 0xaa0000;
    }
    now._4_4_ = (UA_UInt32)((lVar4 - UVar3) / 10000);
  }
  return 0;
}

Assistant:

UA_StatusCode
UA_Connection_receiveChunksBlocking(UA_Connection *connection, UA_ByteString *chunks,
                                    UA_Boolean *realloced, UA_UInt32 timeout) {
    UA_DateTime now = UA_DateTime_nowMonotonic();
    UA_DateTime maxDate = now + (timeout * UA_MSEC_TO_DATETIME);
    *realloced = false;

    UA_StatusCode retval = UA_STATUSCODE_GOOD;
    while(true) {
        /* Listen for messages to arrive */
        retval = connection->recv(connection, chunks, timeout);

        /* Get complete chunks and return */
        retval |= UA_Connection_completeMessages(connection, chunks, realloced);
        if(retval != UA_STATUSCODE_GOOD || chunks->length > 0)
            break;

        /* We received a message. But the chunk is incomplete. Compute the
         * remaining timeout. */
        now = UA_DateTime_nowMonotonic();
        if(now > maxDate)
            return UA_STATUSCODE_GOODNONCRITICALTIMEOUT;
        timeout = (UA_UInt32)((maxDate - now) / UA_MSEC_TO_DATETIME);
    }
    return retval;
}